

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mod.c
# Opt level: O1

void ppDivMod(word *b,word *divident,word *a,word *mod,size_t n,void *stack)

{
  word *b_00;
  word *b_01;
  word *a_00;
  int iVar1;
  bool_t bVar2;
  size_t n_00;
  size_t n_01;
  
  b_00 = (word *)((long)stack + n * 8);
  b_01 = b_00 + n;
  a_00 = b_01 + n;
  wwCopy(b_01,divident,n);
  wwSetZero(a_00,n);
  wwCopy((word *)stack,a,n);
  n_00 = wwWordSize((word *)stack,n);
  wwCopy(b_00,mod,n);
  iVar1 = wwIsZero((word *)stack,n_00);
  n_01 = n;
  while (iVar1 == 0) {
    while (bVar2 = wwTestBit((word *)stack,0), bVar2 == 0) {
      bVar2 = wwTestBit(b_01,0);
      if (bVar2 != 0) {
        wwXor2(b_01,mod,n);
      }
      wwShLo(b_01,n,1);
      wwShLo((word *)stack,n_00,1);
    }
    while (bVar2 = wwTestBit(b_00,0), bVar2 == 0) {
      bVar2 = wwTestBit(a_00,0);
      if (bVar2 != 0) {
        wwXor2(a_00,mod,n);
      }
      wwShLo(a_00,n,1);
      wwShLo(b_00,n_01,1);
    }
    n_00 = wwWordSize((word *)stack,n_00);
    n_01 = wwWordSize(b_00,n_01);
    iVar1 = wwCmp2((word *)stack,n_00,b_00,n_01);
    if (iVar1 < 0) {
      wwXor2(b_00,(word *)stack,n_00);
      wwXor2(a_00,b_01,n);
    }
    else {
      wwXor2((word *)stack,b_00,n_01);
      wwXor2(b_01,a_00,n);
    }
    iVar1 = wwIsZero((word *)stack,n_00);
  }
  bVar2 = wwIsW(b_00,n_01,1);
  if (bVar2 != 0) {
    wwCopy(b,a_00,n);
    return;
  }
  wwSetZero(b,n);
  return;
}

Assistant:

void ppDivMod(word b[], const word divident[], const word a[],
	const word mod[], size_t n, void* stack)
{
	size_t nu, nv;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	word* da0 = v + n;
	word* da = da0 + n;
	stack = da + n;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwCmp(divident, mod, n) < 0);
	ASSERT(n > 0 && mod[n - 1] != 0 && wwTestBit(mod, 0));
	ASSERT(wwIsValid(b, n));
	// da0 <- divident, da <- 0
	wwCopy(da0, divident, n);
	wwSetZero(da, n);
	// u <- a, v <- mod
	wwCopy(u, a, n);
	nu = wwWordSize(u, n);
	wwCopy(v, mod, n);
	nv = n;
	// итерации со следующими инвариантами:
	//	da0 * a \equiv divident * u \mod mod
	//	da * a \equiv divident * v \mod mod
	while (!wwIsZero(u, nu))
	{
		// пока u делится на x
		for (; wwTestBit(u, 0) == 0; wwShLo(u, nu, 1))
			if (wwTestBit(da0, 0) == 0)
				// da0 <- da0 / x
				wwShLo(da0, n, 1);
			else
				// da0 <- (da0 + mod) / 2
				wwXor2(da0, mod, n), wwShLo(da0, n, 1);
		// пока v делится на x
		for (; wwTestBit(v, 0) == 0; wwShLo(v, nv, 1))
			if (wwTestBit(da, 0) == 0)
				// da <- da / x
				wwShLo(da, n, 1);
			else
				// da <- (da + mod) / 2
				wwXor2(da, mod, n), wwShLo(da, n, 1);
		// нормализация
		nu = wwWordSize(u, nu);
		nv = wwWordSize(v, nv);
		// u >= v?
		if (wwCmp2(u, nu, v, nv) >= 0)
		{
			// u <- u + v, da0 <- da0 + da
			wwXor2(u, v, nv);
			wwXor2(da0, da, n);
		}
		else
		{
			// v <- v + u, da <- da + da0
			wwXor2(v, u, nu);
			wwXor2(da, da0, n);
		}
	}
	// здесь v == \gcd(a, mod)
	EXPECT(wwIsW(v, nv, 1));
	// \gcd(a, mod) == 1 ? b <- da : b <- 0
	if (wwIsW(v, nv, 1))
		wwCopy(b, da, n);
	else
		wwSetZero(b, n);
}